

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChargeR.cpp
# Opt level: O1

void __thiscall OpenMD::ChargeR::process(ChargeR *this)

{
  undefined8 *puVar1;
  vector<OpenMD::StuntDouble*,std::allocator<OpenMD::StuntDouble*>> *this_00;
  pointer pOVar2;
  pointer pvVar3;
  long lVar4;
  iterator __position;
  pointer pdVar5;
  StuntDouble *pSVar6;
  AtomType *pAVar7;
  SelectionManager *this_01;
  bool bVar8;
  uint i;
  int iVar9;
  int iVar10;
  pointer ppSVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  double tmp;
  double dVar17;
  RealType RVar18;
  double dVar19;
  int ii;
  FixedChargeAdapter fca;
  StuntDouble *sd;
  FluctuatingChargeAdapter fqa;
  DumpReader reader;
  int local_12dc;
  SelectionSet local_12d8;
  double local_12c0;
  double local_12b8;
  StuntDouble *local_12b0;
  SelectionEvaluator *local_12a8;
  SelectionManager *local_12a0;
  ulong local_1298;
  FluctuatingChargeAdapter local_1290;
  DumpReader local_1288;
  
  DumpReader::DumpReader
            (&local_1288,(this->super_StaticAnalyser).info_,
             &(this->super_StaticAnalyser).dumpFilename_);
  iVar9 = DumpReader::getNFrames(&local_1288);
  this->nProcessed_ = iVar9 / (this->super_StaticAnalyser).step_;
  if (0 < iVar9) {
    local_12a8 = &this->evaluator_;
    local_12a0 = &this->seleMan_;
    uVar15 = 0;
    do {
      this_01 = local_12a0;
      local_1298 = uVar15;
      DumpReader::readFrame(&local_1288,(int)uVar15);
      this->currentSnapshot_ = ((this->super_StaticAnalyser).info_)->sman_->currentSnapshot_;
      uVar15 = (ulong)(this->super_StaticAnalyser).nBins_;
      if (uVar15 != 0) {
        pvVar3 = (this->sliceSDLists_).
                 super__Vector_base<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar13 = 0;
        do {
          lVar4 = *(long *)((long)&(pvVar3->
                                   super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                                   )._M_impl.super__Vector_impl_data._M_start + lVar13);
          if (*(long *)((long)&(pvVar3->
                               super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                               )._M_impl.super__Vector_impl_data._M_finish + lVar13) != lVar4) {
            *(long *)((long)&(pvVar3->
                             super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                             )._M_impl.super__Vector_impl_data._M_finish + lVar13) = lVar4;
          }
          lVar13 = lVar13 + 0x18;
        } while (uVar15 * 0x18 != lVar13);
      }
      if ((this->evaluator_).isDynamic_ != false) {
        SelectionEvaluator::evaluate(&local_12d8,local_12a8);
        lVar13 = 0;
        do {
          std::vector<bool,_std::allocator<bool>_>::operator=
                    ((vector<bool,_std::allocator<bool>_> *)
                     ((long)&(((this->seleMan_).ss_.bitsets_.
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                             super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                     lVar13),(vector<bool,_std::allocator<bool>_> *)
                             ((long)&((local_12d8.bitsets_.
                                       super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                                     super__Bvector_base<std::allocator<bool>_>._M_impl.
                                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                             + lVar13));
          lVar13 = lVar13 + 0x28;
        } while (lVar13 != 0xf0);
        std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                  (&local_12d8.bitsets_);
      }
      local_12b0 = SelectionManager::beginSelected(this_01,&local_12dc);
      while (local_12b0 != (StuntDouble *)0x0) {
        lVar13 = *(long *)((long)&(local_12b0->snapshotMan_->currentSnapshot_->atomData).position.
                                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + local_12b0->storage_);
        local_12d8.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             *(pointer *)(lVar13 + 0x10 + (long)local_12b0->localIndex_ * 0x18);
        puVar1 = (undefined8 *)(lVar13 + (long)local_12b0->localIndex_ * 0x18);
        local_12d8.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)*puVar1;
        local_12d8.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)puVar1[1];
        dVar17 = 0.0;
        lVar13 = 0;
        do {
          pOVar2 = (&local_12d8.bitsets_.
                     super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                     ._M_impl.super__Vector_impl_data._M_start)[lVar13];
          dVar17 = dVar17 + (double)pOVar2 * (double)pOVar2;
          lVar13 = lVar13 + 1;
        } while (lVar13 != 3);
        if (dVar17 < 0.0) {
          dVar17 = sqrt(dVar17);
        }
        else {
          dVar17 = SQRT(dVar17);
        }
        if (dVar17 < this->len_) {
          iVar10 = (int)(dVar17 / this->deltaR_);
          this_00 = (vector<OpenMD::StuntDouble*,std::allocator<OpenMD::StuntDouble*>> *)
                    ((this->sliceSDLists_).
                     super__Vector_base<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + iVar10);
          __position._M_current = *(StuntDouble ***)(this_00 + 8);
          if (__position._M_current == *(StuntDouble ***)(this_00 + 0x10)) {
            std::vector<OpenMD::StuntDouble*,std::allocator<OpenMD::StuntDouble*>>::
            _M_realloc_insert<OpenMD::StuntDouble*const&>(this_00,__position,&local_12b0);
          }
          else {
            *__position._M_current = local_12b0;
            *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
          }
          pdVar5 = (this->sliceSDCount_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                   .super__Vector_impl_data._M_start;
          pdVar5[iVar10] = pdVar5[iVar10] + 1.0;
        }
        local_12b0 = SelectionManager::nextSelected(this_01,&local_12dc);
      }
      local_12b0 = (StuntDouble *)0x0;
      if ((this->super_StaticAnalyser).nBins_ != 0) {
        uVar15 = 0;
        do {
          pvVar3 = (this->sliceSDLists_).
                   super__Vector_base<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          ppSVar11 = pvVar3[uVar15].
                     super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          if (pvVar3[uVar15].
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_finish == ppSVar11) {
            dVar17 = 0.0;
          }
          else {
            dVar17 = 0.0;
            uVar12 = 0;
            uVar16 = 1;
            do {
              pSVar6 = ppSVar11[uVar12];
              dVar19 = 0.0;
              if (pSVar6->objType_ < otRigidBody) {
                pAVar7 = (AtomType *)pSVar6[1]._vptr_StuntDouble;
                local_12d8.bitsets_.
                super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                _M_impl.super__Vector_impl_data._M_start = (pointer)pAVar7;
                local_12b8 = dVar17;
                bVar8 = FixedChargeAdapter::isFixedCharge((FixedChargeAdapter *)&local_12d8);
                dVar17 = 0.0;
                if (bVar8) {
                  RVar18 = FixedChargeAdapter::getCharge((FixedChargeAdapter *)&local_12d8);
                  dVar17 = RVar18 + 0.0;
                }
                local_12c0 = dVar17;
                local_1290.at_ = pAVar7;
                bVar8 = FluctuatingChargeAdapter::isFluctuatingCharge(&local_1290);
                dVar17 = local_12b8;
                dVar19 = local_12c0;
                if (bVar8) {
                  dVar19 = local_12c0 +
                           *(double *)
                            (*(long *)((long)&(pSVar6->snapshotMan_->currentSnapshot_->atomData).
                                              flucQPos.
                                              super__Vector_base<double,_std::allocator<double>_>.
                                              _M_impl.super__Vector_impl_data._M_start +
                                      pSVar6->storage_) + (long)pSVar6->localIndex_ * 8);
                }
              }
              dVar17 = dVar17 + dVar19;
              pvVar3 = (this->sliceSDLists_).
                       super__Vector_base<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              ppSVar11 = pvVar3[uVar15].
                         super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              bVar8 = uVar16 < (ulong)((long)pvVar3[uVar15].
                                             super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)ppSVar11 >> 3);
              uVar12 = uVar16;
              uVar16 = (ulong)((int)uVar16 + 1);
            } while (bVar8);
          }
          pdVar5 = (this->chargeR_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar5[uVar15] = dVar17 + pdVar5[uVar15];
          uVar15 = uVar15 + 1;
        } while (uVar15 < (this->super_StaticAnalyser).nBins_);
      }
      uVar14 = (int)local_1298 + (this->super_StaticAnalyser).step_;
      uVar15 = (ulong)uVar14;
    } while ((int)uVar14 < iVar9);
  }
  (*(this->super_StaticAnalyser)._vptr_StaticAnalyser[4])(this);
  DumpReader::~DumpReader(&local_1288);
  return;
}

Assistant:

void ChargeR::process() {
    StuntDouble* sd;
    int ii;

    DumpReader reader(info_, dumpFilename_);
    int nFrames = reader.getNFrames();
    nProcessed_ = nFrames / step_;

    for (int istep = 0; istep < nFrames; istep += step_) {
      reader.readFrame(istep);
      currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();

      for (unsigned int i = 0; i < nBins_; i++) {
        sliceSDLists_[i].clear();
      }

      if (evaluator_.isDynamic()) {
        seleMan_.setSelectionSet(evaluator_.evaluate());
      }

      // determine which atom belongs to which slice
      for (sd = seleMan_.beginSelected(ii); sd != NULL;
           sd = seleMan_.nextSelected(ii)) {
        Vector3d pos      = sd->getPos();
        RealType distance = pos.length();

        if (distance < len_) {
          int binNo = int(distance / deltaR_);
          sliceSDLists_[binNo].push_back(sd);
          sliceSDCount_[binNo]++;
        }
      }

      // loop over the slices to calculate the charge
      for (unsigned int i = 0; i < nBins_; i++) {
        RealType binC = 0;
        for (unsigned int k = 0; k < sliceSDLists_[i].size(); ++k) {
          RealType q = 0.0;
          Atom* atom = static_cast<Atom*>(sliceSDLists_[i][k]);

          AtomType* atomType = atom->getAtomType();

          if (sliceSDLists_[i][k]->isAtom()) {
            FixedChargeAdapter fca = FixedChargeAdapter(atomType);
            if (fca.isFixedCharge()) { q += fca.getCharge(); }

            FluctuatingChargeAdapter fqa = FluctuatingChargeAdapter(atomType);
            if (fqa.isFluctuatingCharge()) { q += atom->getFlucQPos(); }
          }

          binC += q;
        }
        chargeR_[i] += binC;
        // Units of (e / Ang^2 / fs)
      }
    }

    writeChargeR();
  }